

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::im2col_sgemm_int8_sse_xop(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  uint uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  uint _h;
  long lVar15;
  int iVar16;
  int *piVar17;
  ulong *puVar18;
  ulong *puVar19;
  long lVar20;
  size_t sVar21;
  undefined1 *puVar22;
  undefined4 *puVar23;
  long lVar24;
  ulong uVar25;
  undefined4 *puVar26;
  int iVar27;
  long lVar28;
  void *pvVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  undefined4 *puVar35;
  void *pvVar36;
  uint uVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  undefined1 (*pauVar40) [16];
  ulong *puVar41;
  undefined4 *puVar42;
  void *pvVar43;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  Mat local_98;
  Mat *local_50;
  Mat *local_48;
  long local_40;
  ulong local_38;
  undefined1 auVar45 [64];
  undefined1 auVar47 [64];
  
  uVar3 = bottom_im2col->w;
  iVar32 = bottom_im2col->h;
  uVar37 = bottom_im2col->c;
  lVar33 = (long)(int)uVar37;
  iVar4 = top_blob->c;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  iVar16 = iVar32;
  uVar12 = uVar3;
  if (lVar33 < 4) {
    iVar30 = 1;
    sVar21 = 1;
    _h = uVar37;
    if (1 < (int)uVar3) {
      iVar16 = iVar32 * 2;
      uVar12 = (uVar3 & 1) + (uVar3 >> 1);
      iVar30 = 1;
    }
  }
  else if ((int)uVar3 < 2) {
    iVar30 = 4;
    sVar21 = 4;
    _h = (uVar37 & 3) + (uVar37 >> 2);
  }
  else {
    sVar21 = 4;
    iVar16 = iVar32 * 2;
    _h = (uVar37 & 3) + (uVar37 >> 2);
    uVar12 = (uVar3 & 1) + (uVar3 >> 1);
    iVar30 = 4;
  }
  local_50 = top_blob;
  local_48 = kernel;
  Mat::create(&local_98,iVar16,_h,uVar12,sVar21,iVar30,opt->workspace_allocator);
  uVar11 = (ulong)(int)uVar3;
  if (0 < (int)uVar3 >> 1) {
    lVar34 = 1;
    uVar38 = 0;
    do {
      puVar22 = (undefined1 *)(local_98.cstep * uVar38 * local_98.elemsize + (long)local_98.data);
      if ((int)uVar37 < 4) {
        uVar25 = 0;
      }
      else {
        lVar24 = 3;
        lVar28 = 1;
        lVar31 = 2;
        uVar14 = 0;
        do {
          if (0 < iVar32) {
            lVar20 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar15 = (long)bottom_im2col->data + lVar34;
            iVar16 = iVar32;
            do {
              *puVar22 = *(undefined1 *)(lVar15 + -1 + lVar20 * uVar14);
              puVar22[1] = *(undefined1 *)(lVar15 + -1 + lVar20 * lVar28);
              puVar22[2] = *(undefined1 *)(lVar15 + -1 + lVar20 * lVar31);
              puVar22[3] = *(undefined1 *)(lVar15 + -1 + lVar20 * lVar24);
              puVar22[4] = *(undefined1 *)(lVar15 + lVar20 * uVar14);
              puVar22[5] = *(undefined1 *)(lVar15 + lVar20 * lVar28);
              puVar22[6] = *(undefined1 *)(lVar15 + lVar20 * lVar31);
              puVar22[7] = *(undefined1 *)(lVar15 + lVar20 * lVar24);
              puVar22 = puVar22 + 8;
              lVar15 = lVar15 + uVar11;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar25 = uVar14 + 4;
          lVar15 = uVar14 + 7;
          lVar24 = lVar24 + 4;
          lVar28 = lVar28 + 4;
          lVar31 = lVar31 + 4;
          uVar14 = uVar25;
        } while (lVar15 < lVar33);
      }
      if ((int)uVar25 < (int)uVar37) {
        uVar25 = uVar25 & 0xffffffff;
        do {
          if (0 < iVar32) {
            lVar24 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar25;
            lVar28 = (long)bottom_im2col->data + lVar34;
            iVar16 = iVar32;
            do {
              *puVar22 = *(undefined1 *)(lVar28 + -1 + lVar24);
              puVar22[1] = *(undefined1 *)(lVar28 + lVar24);
              puVar22 = puVar22 + 2;
              lVar28 = lVar28 + uVar11;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar37);
      }
      uVar38 = uVar38 + 1;
      lVar34 = lVar34 + 2;
    } while (uVar38 != (uint)((int)uVar3 >> 1));
  }
  uVar38 = uVar11 & 0xfffffffffffffffe;
  if ((uint)uVar38 != uVar3) {
    do {
      uVar12 = ((uint)(uVar38 >> 0x1f) & 1) + (int)uVar38;
      puVar22 = (undefined1 *)
                (local_98.elemsize * local_98.cstep *
                 (long)(int)(((int)uVar12 >> 1) + ((int)uVar38 - (uVar12 & 0xfffffffe))) +
                (long)local_98.data);
      if ((int)uVar37 < 4) {
        uVar25 = 0;
      }
      else {
        lVar34 = 1;
        lVar24 = 2;
        lVar28 = 3;
        uVar14 = 0;
        do {
          if (0 < iVar32) {
            lVar31 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar15 = (long)bottom_im2col->data + uVar38;
            iVar16 = iVar32;
            do {
              *puVar22 = *(undefined1 *)(lVar15 + lVar31 * uVar14);
              puVar22[1] = *(undefined1 *)(lVar15 + lVar31 * lVar34);
              puVar22[2] = *(undefined1 *)(lVar15 + lVar31 * lVar24);
              puVar22[3] = *(undefined1 *)(lVar15 + lVar31 * lVar28);
              puVar22 = puVar22 + 4;
              lVar15 = lVar15 + uVar11;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar25 = uVar14 + 4;
          lVar31 = uVar14 + 7;
          lVar34 = lVar34 + 4;
          lVar24 = lVar24 + 4;
          lVar28 = lVar28 + 4;
          uVar14 = uVar25;
        } while (lVar31 < lVar33);
      }
      if ((int)uVar25 < (int)uVar37) {
        uVar25 = uVar25 & 0xffffffff;
        do {
          if (0 < iVar32) {
            puVar13 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar38 + bottom_im2col->cstep * uVar25 * bottom_im2col->elemsize);
            iVar16 = iVar32;
            do {
              *puVar22 = *puVar13;
              puVar22 = puVar22 + 1;
              puVar13 = puVar13 + uVar11;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar37);
      }
      uVar38 = uVar38 + 1;
    } while ((long)uVar38 < (long)uVar11);
  }
  if (0 < iVar4 >> 2) {
    pvVar5 = local_50->data;
    lVar33 = local_50->elemsize * local_50->cstep;
    pvVar6 = local_48->data;
    local_40 = local_48->elemsize * local_48->cstep;
    uVar12 = uVar37 + 3;
    if (-1 < (int)uVar37) {
      uVar12 = uVar37;
    }
    iVar16 = ((int)uVar12 >> 2) * iVar32;
    iVar30 = ((int)uVar37 % 4) * iVar32;
    local_38 = (ulong)(uint)(iVar4 >> 2);
    uVar38 = 0;
    do {
      puVar35 = (undefined4 *)(uVar38 * 4 * lVar33 + (long)pvVar5);
      puVar23 = (undefined4 *)((uVar38 * 4 + 1) * lVar33 + (long)pvVar5);
      puVar42 = (undefined4 *)((uVar38 * 4 + 2) * lVar33 + (long)pvVar5);
      puVar26 = (undefined4 *)((uVar38 * 4 + 3) * lVar33 + (long)pvVar5);
      if ((int)uVar3 < 2) {
        uVar25 = 0;
      }
      else {
        pauVar39 = (undefined1 (*) [16])(uVar38 * local_40 + (long)pvVar6);
        uVar14 = 0;
        do {
          puVar18 = (ulong *)((uVar14 >> 1) * local_98.elemsize * local_98.cstep +
                             (long)local_98.data);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          auVar44 = (undefined1  [16])0x0;
          if (0 < iVar16) {
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *puVar18;
            auVar8 = vpmovsxbw_avx(auVar44);
            auVar44 = *pauVar39;
            auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
            vpunpcklbw_avx(auVar44,auVar46);
            vpunpckhbw_avx(auVar44,auVar46);
            vpshufd_avx(auVar8,0x44);
            halt_baddata();
          }
          auVar47 = ZEXT1664((undefined1  [16])0x0);
          auVar46 = (undefined1  [16])0x0;
          if (0 < iVar30) {
            lVar34 = 0;
            do {
              auVar44 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar18 + lVar34 * 2)));
              auVar44 = vpshuflw_avx(auVar44,0x50);
              auVar9 = vpshufd_avx(auVar44,0x50);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)(*pauVar39 + lVar34 * 4);
              auVar44 = vpmovsxbw_avx(auVar46);
              auVar44 = vpshufd_avx(auVar44,0x44);
              auVar8 = vpmullw_avx(auVar9,auVar44);
              auVar44 = vpmulhw_avx(auVar9,auVar44);
              auVar46 = vpunpcklwd_avx(auVar8,auVar44);
              auVar46 = vpaddd_avx(auVar47._0_16_,auVar46);
              auVar47 = ZEXT1664(auVar46);
              auVar44 = vpunpckhwd_avx(auVar8,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar34 = lVar34 + 1;
            } while (iVar30 != (int)lVar34);
          }
          *puVar35 = auVar46._0_4_;
          *puVar23 = auVar46._4_4_;
          *puVar42 = auVar46._8_4_;
          *puVar26 = auVar46._12_4_;
          puVar35[1] = auVar44._0_4_;
          puVar23[1] = auVar44._4_4_;
          puVar42[1] = auVar44._8_4_;
          puVar26[1] = auVar44._12_4_;
          puVar35 = puVar35 + 2;
          puVar23 = puVar23 + 2;
          puVar42 = puVar42 + 2;
          puVar26 = puVar26 + 2;
          uVar25 = uVar14 + 2;
          lVar34 = uVar14 + 3;
          uVar14 = uVar25;
        } while (lVar34 < (long)uVar11);
      }
      if ((int)uVar25 < (int)uVar3) {
        pauVar39 = (undefined1 (*) [16])(uVar38 * local_40 + (long)pvVar6);
        do {
          puVar18 = (ulong *)((ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                              local_98.elemsize * local_98.cstep + (long)local_98.data);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          pauVar40 = pauVar39;
          if (0 < iVar16) {
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar27 = iVar16;
            do {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *puVar18;
              auVar8 = vpmovsxbw_avx(auVar8);
              auVar44 = *pauVar40;
              auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
              auVar10 = vpunpcklbw_avx(auVar44,auVar46);
              auVar9 = vpunpckhbw_avx(auVar44,auVar46);
              auVar44 = vpshufd_avx(auVar8,0x44);
              auVar8 = vpmullw_avx(auVar10,auVar44);
              auVar46 = vpmulhw_avx(auVar10,auVar44);
              auVar10 = vpmullw_avx(auVar44,auVar9);
              auVar9 = vpmulhw_avx(auVar44,auVar9);
              auVar44 = vpunpcklwd_avx(auVar8,auVar46);
              auVar44 = vpaddd_avx(auVar50._0_16_,auVar44);
              auVar50 = ZEXT1664(auVar44);
              auVar46 = vpunpckhwd_avx(auVar8,auVar46);
              auVar46 = vpaddd_avx(auVar49._0_16_,auVar46);
              auVar49 = ZEXT1664(auVar46);
              auVar8 = vpunpcklwd_avx(auVar10,auVar9);
              auVar8 = vpaddd_avx(auVar47._0_16_,auVar8);
              auVar47 = ZEXT1664(auVar8);
              auVar9 = vpunpckhwd_avx(auVar10,auVar9);
              auVar9 = vpaddd_avx(auVar45._0_16_,auVar9);
              auVar45 = ZEXT1664(auVar9);
              puVar18 = (ulong *)((long)puVar18 + 4);
              pauVar40 = pauVar40 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
            auVar10 = vpunpckldq_avx(auVar44,auVar46);
            auVar48 = vpunpckldq_avx(auVar8,auVar9);
            auVar46 = vpunpckhdq_avx(auVar44,auVar46);
            auVar8 = vpunpckhdq_avx(auVar8,auVar9);
            auVar9 = vpunpcklqdq_avx(auVar10,auVar48);
            auVar44 = vpunpckhqdq_avx(auVar10,auVar48);
            auVar44 = vpaddd_avx(auVar9,auVar44);
            auVar9 = vpunpcklqdq_avx(auVar46,auVar8);
            auVar46 = vpunpckhqdq_avx(auVar46,auVar8);
            auVar46 = vpaddd_avx(auVar46,auVar9);
            auVar44 = vpaddd_avx(auVar44,auVar46);
            auVar45 = ZEXT1664(auVar44);
          }
          auVar44 = auVar45._0_16_;
          if (0 < iVar30) {
            lVar34 = 0;
            do {
              auVar44 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar18 + lVar34)),0);
              auVar8 = vpshufd_avx(auVar44,0);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(*pauVar40 + lVar34 * 4);
              auVar44 = vpmovsxbw_avx(auVar9);
              auVar46 = vpmullw_avx(auVar8,auVar44);
              auVar44 = vpmulhw_avx(auVar8,auVar44);
              auVar44 = vpunpcklwd_avx(auVar46,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar34 = lVar34 + 1;
            } while (iVar30 != (int)lVar34);
          }
          *puVar35 = auVar44._0_4_;
          *puVar23 = auVar44._4_4_;
          *puVar42 = auVar44._8_4_;
          *puVar26 = auVar44._12_4_;
          puVar35 = puVar35 + 1;
          puVar23 = puVar23 + 1;
          puVar42 = puVar42 + 1;
          puVar26 = puVar26 + 1;
          uVar12 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar12;
        } while (uVar12 != uVar3);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != local_38);
  }
  uVar38 = (long)iVar4 & 0xfffffffffffffffc;
  if ((int)uVar38 != iVar4) {
    sVar21 = local_50->elemsize;
    sVar7 = local_50->cstep;
    pvVar5 = local_50->data;
    lVar33 = local_48->elemsize * local_48->cstep;
    uVar12 = uVar37 + 3;
    if (-1 < (int)uVar37) {
      uVar12 = uVar37;
    }
    pvVar6 = local_48->data;
    iVar16 = ((int)uVar12 >> 2) * iVar32;
    iVar32 = ((int)uVar37 % 4) * iVar32;
    do {
      piVar17 = (int *)(sVar21 * sVar7 * uVar38 + (long)pvVar5);
      uVar37 = (uint)uVar38;
      if ((int)uVar3 < 2) {
        uVar25 = 0;
      }
      else {
        uVar12 = uVar37 + 3;
        if (-1 < (int)uVar37) {
          uVar12 = uVar37;
        }
        puVar18 = (ulong *)((int)(((int)uVar12 >> 2) + (uVar37 - (uVar12 & 0xfffffffc))) * lVar33 +
                           (long)pvVar6);
        uVar14 = 0;
        do {
          puVar41 = (ulong *)((uVar14 >> 1) * local_98.elemsize * local_98.cstep +
                             (long)local_98.data);
          puVar19 = puVar18;
          if (iVar16 < 1) {
            iVar30 = 0;
            iVar27 = 0;
          }
          else {
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar16;
            do {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = *puVar41;
              auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar48);
              auVar46 = vpunpcklbw_avx(auVar48,auVar44);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *puVar19;
              auVar44 = vpmovsxbw_avx(auVar10);
              auVar44 = vpshufd_avx(auVar44,0x44);
              auVar8 = vpmullw_avx(auVar44,auVar46);
              auVar46 = vpmulhw_avx(auVar46,auVar44);
              auVar44 = vpunpcklwd_avx(auVar8,auVar46);
              auVar44 = vpaddd_avx(auVar47._0_16_,auVar44);
              auVar47 = ZEXT1664(auVar44);
              auVar46 = vpunpckhwd_avx(auVar8,auVar46);
              auVar46 = vpaddd_avx(auVar45._0_16_,auVar46);
              auVar45 = ZEXT1664(auVar46);
              puVar41 = puVar41 + 1;
              puVar19 = (ulong *)((long)puVar19 + 4);
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar30 = auVar44._0_4_;
            auVar44 = vphaddd_avx(auVar46,auVar46);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar27 = auVar44._0_4_;
          }
          if (0 < iVar32) {
            lVar34 = 0;
            do {
              iVar30 = iVar30 + (int)*(char *)((long)puVar41 + lVar34 * 2) *
                                (int)*(char *)((long)puVar19 + lVar34);
              iVar27 = iVar27 + (int)*(char *)((long)puVar41 + lVar34 * 2 + 1) *
                                (int)*(char *)((long)puVar19 + lVar34);
              lVar34 = lVar34 + 1;
            } while (iVar32 != (int)lVar34);
          }
          *piVar17 = iVar30;
          piVar17[1] = iVar27;
          piVar17 = piVar17 + 2;
          uVar25 = uVar14 + 2;
          lVar34 = uVar14 + 3;
          uVar14 = uVar25;
        } while (lVar34 < (long)uVar11);
      }
      if ((int)uVar25 < (int)uVar3) {
        uVar12 = uVar37 + 3;
        if (-1 < (int)uVar37) {
          uVar12 = uVar37;
        }
        pvVar43 = (void *)((int)(((int)uVar12 >> 2) + (uVar37 - (uVar12 & 0xfffffffc))) * lVar33 +
                          (long)pvVar6);
        do {
          pvVar36 = (void *)((ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                             local_98.elemsize * local_98.cstep + (long)local_98.data);
          if (iVar16 < 1) {
            iVar30 = 0;
            pvVar29 = pvVar43;
          }
          else {
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar24 = 0;
            lVar34 = 0;
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar36 + lVar34 * 4);
              auVar44 = vpmovsxbw_avx(auVar1);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)((long)pvVar43 + lVar34 * 4);
              auVar46 = vpmovsxbw_avx(auVar2);
              auVar8 = vpmullw_avx(auVar46,auVar44);
              auVar44 = vpmulhw_avx(auVar44,auVar46);
              auVar44 = vpunpcklwd_avx(auVar8,auVar44);
              auVar44 = vpaddd_avx(auVar45._0_16_,auVar44);
              auVar45 = ZEXT1664(auVar44);
              lVar34 = lVar34 + 1;
              lVar24 = lVar24 + -4;
            } while (iVar16 != (int)lVar34);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            auVar44 = vphaddd_avx(auVar44,auVar44);
            iVar30 = auVar44._0_4_;
            pvVar36 = (void *)((long)pvVar36 - lVar24);
            pvVar29 = (void *)((long)pvVar43 - lVar24);
          }
          if (0 < iVar32) {
            lVar34 = 0;
            do {
              iVar30 = iVar30 + (int)*(char *)((long)pvVar29 + lVar34) *
                                (int)*(char *)((long)pvVar36 + lVar34);
              lVar34 = lVar34 + 1;
            } while (iVar32 != (int)lVar34);
          }
          *piVar17 = iVar30;
          piVar17 = piVar17 + 1;
          uVar37 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar37;
        } while (uVar37 != uVar3);
      }
      uVar38 = uVar38 + 1;
    } while ((long)uVar38 < (long)iVar4);
  }
  piVar17 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_int8_sse(bottom_im2col, top_blob, kernel, opt);
}